

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O2

void __thiscall spv::Builder::postProcessType(Builder *this,Instruction *inst,Id typeId)

{
  Op OVar1;
  bool bVar2;
  Op OVar3;
  int iVar4;
  Id resultId;
  StorageClass SVar5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  char *ext;
  Capability CStack_30;
  
  OVar3 = getMostBasicTypeClass(this,typeId);
  iVar4 = 0;
  if (OVar3 - OpTypeInt < 2) {
    iVar4 = getScalarTypeWidth(this,typeId);
  }
  OVar1 = inst->opCode;
  if (OVar1 - OpUConvert < 3) {
    bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
    if ((bVar2) || (bVar2 = containsType(this,typeId,OpTypeInt,0x10), bVar2)) {
      for (p_Var7 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        if (0xfffffffb < p_Var7[1]._M_color - 0x1155) goto LAB_00367c94;
      }
      bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
      if (bVar2) {
        addCapability(this,CapabilityFloat16);
      }
      bVar2 = containsType(this,typeId,OpTypeInt,0x10);
      if (bVar2) {
        addCapability(this,CapabilityInt16);
      }
    }
LAB_00367c94:
    bVar2 = containsType(this,typeId,OpTypeInt,8);
    if (!bVar2) {
      return;
    }
    for (p_Var7 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      if (0xfffffffc < p_Var7[1]._M_color - 0x1163) {
        return;
      }
    }
  }
  else {
    if (OVar1 - OpLoad < 2) {
      if (OVar3 == OpTypeStruct) {
        bVar2 = containsType(this,typeId,OpTypeInt,8);
        if (bVar2) {
          addCapability(this,CapabilityInt8);
        }
        bVar2 = containsType(this,typeId,OpTypeInt,0x10);
        if (bVar2) {
          addCapability(this,CapabilityInt16);
        }
        bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
        if (!bVar2) {
          return;
        }
      }
      else {
        resultId = Instruction::getIdOperand(inst,0);
        SVar5 = getStorageClass(this,resultId);
        if (iVar4 != 0x10) {
          if (iVar4 != 8) {
            return;
          }
          if ((SVar5 < (StorageBuffer|Input)) && ((0x1204U >> (SVar5 & 0x1f) & 1) != 0)) {
            return;
          }
          if (SVar5 == PhysicalStorageBuffer) {
            return;
          }
          goto LAB_00367dba;
        }
        if ((SVar5 < (StorageBuffer|Input)) && ((0x120eU >> (SVar5 & 0x1f) & 1) != 0)) {
          return;
        }
        if (SVar5 == PhysicalStorageBuffer) {
          return;
        }
        if (OVar3 == OpTypeInt) goto LAB_00367db6;
        if (OVar3 != OpTypeFloat) {
          return;
        }
      }
LAB_00367c4f:
      CStack_30 = CapabilityFloat16;
      goto LAB_00367dbc;
    }
    if (OVar1 == OpExtInst) {
      uVar6 = Instruction::getImmediateOperand(inst,1);
      if (uVar6 - 0x4c < 3) {
        if (0x102ff < this->spvVersion) {
          return;
        }
        bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
        if (!bVar2) {
          return;
        }
        ext = "SPV_AMD_gpu_shader_half_float";
      }
      else {
        if (1 < uVar6 - 0x33) {
          return;
        }
        if (0x102ff < this->spvVersion) {
          return;
        }
        bVar2 = containsType(this,typeId,OpTypeInt,0x10);
        if (!bVar2) {
          return;
        }
        ext = "SPV_AMD_gpu_shader_int16";
      }
      addExtension(this,ext);
      return;
    }
    if ((OVar1 == OpAccessChain) || (OVar1 == OpPtrAccessChain)) {
      if (OVar3 != OpTypeInt) {
        return;
      }
      if ((this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode == OpTypePointer) {
        return;
      }
      if (iVar4 != 8) {
LAB_00367db0:
        if (iVar4 != 0x10) {
          return;
        }
LAB_00367db6:
        CStack_30 = CapabilityInt16;
        goto LAB_00367dbc;
      }
    }
    else {
      if (OVar1 == OpCopyObject) {
        return;
      }
      if (OVar3 != OpTypeInt) {
        if (OVar3 != OpTypeFloat) {
          return;
        }
        if (iVar4 == 0x40) {
          CStack_30 = CapabilityFloat64;
          goto LAB_00367dbc;
        }
        if (iVar4 != 0x10) {
          return;
        }
        goto LAB_00367c4f;
      }
      if (iVar4 != 8) {
        if (iVar4 == 0x40) {
          CStack_30 = CapabilityInt64;
          goto LAB_00367dbc;
        }
        goto LAB_00367db0;
      }
    }
  }
LAB_00367dba:
  CStack_30 = CapabilityInt8;
LAB_00367dbc:
  addCapability(this,CStack_30);
  return;
}

Assistant:

void Builder::postProcessType(const Instruction& inst, Id typeId)
{
    // Characterize the type being questioned
    Id basicTypeOp = getMostBasicTypeClass(typeId);
    int width = 0;
    if (basicTypeOp == OpTypeFloat || basicTypeOp == OpTypeInt)
        width = getScalarTypeWidth(typeId);

    // Do opcode-specific checks
    switch (inst.getOpCode()) {
    case OpLoad:
    case OpStore:
        if (basicTypeOp == OpTypeStruct) {
            if (containsType(typeId, OpTypeInt, 8))
                addCapability(CapabilityInt8);
            if (containsType(typeId, OpTypeInt, 16))
                addCapability(CapabilityInt16);
            if (containsType(typeId, OpTypeFloat, 16))
                addCapability(CapabilityFloat16);
        } else {
            StorageClass storageClass = getStorageClass(inst.getIdOperand(0));
            if (width == 8) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                    break;
                default:
                    addCapability(CapabilityInt8);
                    break;
                }
            } else if (width == 16) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                case StorageClassInput:
                case StorageClassOutput:
                    break;
                default:
                    if (basicTypeOp == OpTypeInt)
                        addCapability(CapabilityInt16);
                    if (basicTypeOp == OpTypeFloat)
                        addCapability(CapabilityFloat16);
                    break;
                }
            }
        }
        break;
    case OpCopyObject:
        break;
    case OpFConvert:
    case OpSConvert:
    case OpUConvert:
        // Look for any 8/16-bit storage capabilities. If there are none, assume that
        // the convert instruction requires the Float16/Int8/16 capability.
        if (containsType(typeId, OpTypeFloat, 16) || containsType(typeId, OpTypeInt, 16)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStorageInputOutput16 ||
                    cap == spv::CapabilityStoragePushConstant16 ||
                    cap == spv::CapabilityStorageUniformBufferBlock16 ||
                    cap == spv::CapabilityStorageUniform16) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                if (containsType(typeId, OpTypeFloat, 16))
                    addCapability(CapabilityFloat16);
                if (containsType(typeId, OpTypeInt, 16))
                    addCapability(CapabilityInt16);
            }
        }
        if (containsType(typeId, OpTypeInt, 8)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStoragePushConstant8 ||
                    cap == spv::CapabilityUniformAndStorageBuffer8BitAccess ||
                    cap == spv::CapabilityStorageBuffer8BitAccess) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                addCapability(CapabilityInt8);
            }
        }
        break;
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450Frexp:
        case GLSLstd450FrexpStruct:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeInt, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_int16);
            break;
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeFloat, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
            break;
        default:
            break;
        }
        break;
    case OpAccessChain:
    case OpPtrAccessChain:
        if (isPointerType(typeId))
            break;
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
        }
        break;
    default:
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
            else if (width == 64)
                addCapability(CapabilityInt64);
        } else if (basicTypeOp == OpTypeFloat) {
            if (width == 16)
                addCapability(CapabilityFloat16);
            else if (width == 64)
                addCapability(CapabilityFloat64);
        }
        break;
    }
}